

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall GEO::ParallelDelaunay3d::~ParallelDelaunay3d(ParallelDelaunay3d *this)

{
  pointer puVar1;
  pointer __ptr;
  pointer __ptr_00;
  pointer piVar2;
  
  (this->super_Delaunay).super_Counted._vptr_Counted =
       (_func_int **)&PTR__ParallelDelaunay3d_001a8aa8;
  puVar1 = (this->levels_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    free(puVar1);
  }
  puVar1 = (this->reorder_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    free(puVar1);
  }
  __ptr = (this->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>.
          super__Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (__ptr != (pointer)0x0) {
    free(__ptr);
  }
  std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
  ~vector(&this->threads_);
  __ptr_00 = (this->cell_thread_).
             super_vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>.
             super__Vector_base<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (__ptr_00 != (pointer)0x0) {
    free(__ptr_00);
  }
  puVar1 = (this->cell_next_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    free(puVar1);
  }
  piVar2 = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    free(piVar2);
  }
  piVar2 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    free(piVar2);
  }
  Delaunay::~Delaunay(&this->super_Delaunay);
  return;
}

Assistant:

class GEOGRAM_API ParallelDelaunay3d : public Delaunay {
    public:
        ParallelDelaunay3d(coord_index_t dimension = 3);

        void set_vertices(
            index_t nb_vertices, const double* vertices
        ) override;

        index_t nearest_vertex(const double* p) const override;

        void set_BRIO_levels(const vector<index_t>& levels) override;

    private:
        vector<signed_index_t> cell_to_v_store_;
        vector<signed_index_t> cell_to_cell_store_;
        vector<index_t> cell_next_;
        vector<thread_index_t> cell_thread_;
        ThreadGroup threads_;
        bool weighted_; // true for regular triangulation.
        vector<double> heights_; // only used in weighted mode.        
        vector<index_t> reorder_;
        vector<index_t> levels_;

         bool debug_mode_;

         bool verbose_debug_mode_;

        bool benchmark_mode_;
        
        
        friend class Delaunay3dThread;
    }